

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O2

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::remove_excess
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,
          vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *sol,vector<int,_std::allocator<int>_> *_dem)

{
  int *piVar1;
  _Rb_tree_header *__last;
  pointer piVar2;
  pointer pIVar3;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *this_00;
  pointer ppVar4;
  int iVar5;
  int iVar6;
  pointer ppVar7;
  mapped_type *pmVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  int *it;
  pointer piVar11;
  key_type *__x;
  pointer ppVar12;
  vector<int,_std::allocator<int>_> rm;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *finalsol;
  map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  mp;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  tmp;
  int local_100;
  allocator_type local_f9;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
  *local_d8;
  pointer local_d0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c8;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_98;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_78;
  pointer local_60;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_58;
  pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_50;
  
  local_78.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60 = (sol->
             super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  __last = &local_c8._M_impl.super__Rb_tree_header;
  ppVar7 = (sol->
           super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_d8 = (vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
              *)__return_storage_ptr__;
  while (ppVar4 = local_78.
                  super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, this_00 = local_d8,
        local_c8._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header,
        local_c8._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header,
        ppVar7 != local_60) {
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    piVar2 = (ppVar7->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_d0 = ppVar7;
    for (piVar11 = (ppVar7->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar11 != piVar2; piVar11 = piVar11 + 1) {
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_c8,piVar11);
      *pmVar8 = *pmVar8 + 1;
    }
    local_f8._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100 = local_d0->first;
    while (0 < local_100) {
      p_Var9 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_f8._M_impl.super__Vector_impl_data._M_finish !=
          local_f8._M_impl.super__Vector_impl_data._M_start) {
        local_f8._M_impl.super__Vector_impl_data._M_finish =
             local_f8._M_impl.super__Vector_impl_data._M_start;
      }
      for (; piVar11 = local_f8._M_impl.super__Vector_impl_data._M_finish,
          __x = local_f8._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var9 != __last;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        iVar5 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start
                [(this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)p_Var9[1]._M_color].type];
        if (*(int *)&p_Var9[1].field_0x4 <= iVar5) {
          iVar5 = *(int *)&p_Var9[1].field_0x4;
        }
        *(int *)&p_Var9[1].field_0x4 = iVar5;
        if (iVar5 == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&local_f8,(value_type *)(p_Var9 + 1));
        }
      }
      for (; __x != piVar11; __x = __x + 1) {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::erase(&local_c8,__x);
      }
      pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_58._M_node = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = local_100;
      for (p_Var10 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != __last;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        iVar6 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[pIVar3[(int)p_Var10[1]._M_color].type] /
                *(int *)&p_Var10[1].field_0x4;
        if (iVar6 < iVar5) {
          iVar5 = iVar6;
        }
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      vector<std::_Rb_tree_iterator<std::pair<int_const,int>>,void>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_98,local_58
                 ,(_Rb_tree_iterator<std::pair<const_int,_int>_>)__last,&local_f9);
      local_50.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_98._M_impl.super__Vector_impl_data._M_start;
      local_50.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98._M_impl.super__Vector_impl_data._M_finish;
      local_50.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_50.first = iVar5;
      std::
      vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
      ::
      emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                ((vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
                  *)&local_78,&local_50);
      local_100 = local_100 - iVar5;
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_50.second.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_98);
      pIVar3 = (this->inst).items.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (p_Var10 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var10 != __last;
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        piVar1 = (_dem->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + pIVar3[(int)p_Var10[1]._M_color].type;
        *piVar1 = *piVar1 - *(int *)&p_Var10[1].field_0x4 * iVar5;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_c8);
    ppVar7 = local_d0 + 1;
  }
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (ppVar12 = local_78.
                 super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar4; ppVar12 = ppVar12 + 1
      ) {
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((ppVar12->second).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (ppVar12->second).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    iVar5 = ppVar12->first;
    pmVar8 = std::
             map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
             ::operator[]((map<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
                           *)&local_c8,&ppVar12->second);
    *pmVar8 = *pmVar8 + iVar5;
  }
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  for (p_Var10 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != __last; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_true>
              (&local_50,(int *)&p_Var10[1]._M_right,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)(p_Var10 + 1));
    std::
    vector<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::allocator<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
    ::
    emplace_back<std::pair<int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (this_00,&local_50);
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&local_50.second.
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
  }
  std::
  _Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>,_std::_Select1st<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>,_std::less<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_int>_>_>
               *)&local_c8);
  std::
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~vector(&local_78);
  return (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          *)this_00;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::remove_excess(const std::vector<pattern_int> &sol,
													std::vector<int> *_dem) const {
	std::vector<int> &dem = *_dem;
	std::vector<pattern_pair> tmp;
	for (const pattern_int &pat : sol) {
		std::map<int, int> count;
		for (const int &it : pat.second) {
			count[it] += 1;
		}
		std::vector<int> rm;
		int rep = pat.first;
		while (rep > 0) {
			rm.clear();
			for (auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				kvpair.second = std::min(kvpair.second, dem[type]);
				if (kvpair.second == 0) {
					rm.push_back(kvpair.first);
				}
			}
			for (const int &ind : rm) {
				count.erase(ind);
			}

			int f = rep;
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				f = std::min(f, dem[type] / kvpair.second);
			}
			rep -= f;

			tmp.push_back(MP(f, std::vector<int_pair>(all(count))));
			for (const auto &kvpair : count) {
				int type = inst.items[kvpair.first].type;
				dem[type] -= f * kvpair.second;
			}
		}
	}

	std::map<std::vector<int_pair>, int> mp;
	for (pattern_pair &pp : tmp) {
		sort(all(pp.second));
		mp[pp.second] += pp.first;
	}

	std::vector<pattern_pair> finalsol;
	for (const auto &kvpair : mp) {
		finalsol.push_back(MP(kvpair.second, kvpair.first));
	}
	return finalsol;
}